

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O2

int bfgs_l_min(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,int m,double *dx,
              double fsval,double maxstep,int MAXITER,int *niter,double eps,double gtol,double ftol,
              double xtol,double *xf)

{
  size_t __size;
  double dVar1;
  int iVar2;
  uint uVar3;
  double *f;
  double *tsk;
  double *tyk;
  ulong uVar4;
  undefined4 in_register_0000000c;
  double *pdVar5;
  double *pdVar6;
  size_t __size_00;
  long lVar7;
  ulong uVar8;
  double dVar9;
  ulong extraout_XMM0_Qb;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  int N_00;
  double local_140;
  double alpha;
  long local_130;
  ulong local_128;
  long local_120;
  double *local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  double local_f0;
  double local_e8;
  custom_gradient *local_e0;
  undefined1 local_d8 [16];
  undefined4 local_c0;
  undefined4 uStack_bc;
  double fxf;
  double *local_b0;
  void *local_a8;
  double *local_a0;
  double local_98;
  ulong local_90;
  custom_function *local_88;
  double local_80;
  double *local_78;
  double *local_70;
  double *local_68;
  double *local_60;
  double *local_58;
  double local_50;
  double *local_48;
  ulong local_40;
  int local_34;
  
  local_40 = CONCAT44(in_register_0000000c,N);
  lVar7 = (long)N;
  __size = lVar7 * 8;
  alpha = xtol;
  local_118 = (double *)fsval;
  local_f0 = ftol;
  local_e8 = eps;
  local_e0 = funcgrad;
  local_98 = gtol;
  local_88 = funcpt;
  local_50 = maxstep;
  local_48 = xi;
  f = (double *)malloc(__size);
  local_70 = (double *)malloc(__size);
  local_b0 = (double *)malloc(__size);
  local_58 = (double *)malloc(__size);
  local_a0 = (double *)malloc(__size * lVar7);
  local_a8 = malloc(__size);
  __size_00 = m * lVar7 * 8;
  local_130 = lVar7;
  local_90 = (ulong)(uint)m;
  local_68 = (double *)malloc(__size_00);
  local_60 = (double *)malloc(__size_00);
  tsk = (double *)malloc(__size);
  tyk = (double *)malloc(__size);
  *niter = 0;
  if (local_e8 < 0.0) {
    local_80 = sqrt(local_e8);
  }
  else {
    local_80 = SQRT(local_e8);
  }
  local_140 = 1.0;
  uVar4 = 0;
  uVar8 = 0;
  if (0 < (int)local_40) {
    uVar8 = local_40 & 0xffffffff;
  }
  for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
    local_48[uVar4] = dx[uVar4] * local_48[uVar4];
    dx[uVar4] = 1.0 / dx[uVar4];
  }
  local_108 = (*local_88->funcpt)(local_48,(int)local_40,local_88->params);
  local_34 = 0;
  local_d8._8_4_ = (int)(extraout_XMM0_Qb & 0x7fffffffffffffff);
  local_d8._0_8_ = ABS(local_108);
  local_d8._12_4_ = (int)((extraout_XMM0_Qb & 0x7fffffffffffffff) >> 0x20);
  uStack_100 = extraout_XMM0_Qb;
  if (1.79769313486232e+308 <= ABS(local_108)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    local_34 = 0xf;
  }
  if (NAN(local_108)) {
    printf("Program Exiting as the function returns NaN");
    local_34 = 0xf;
  }
  iVar2 = grad_fd(local_88,local_e0,local_48,(int)local_40,dx,local_80,f);
  if (iVar2 == 0xf) {
    local_34 = 0xf;
  }
  dVar12 = 0.0;
  if (local_50 <= 0.0) {
    dVar9 = 0.0;
    for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      dVar1 = dx[uVar4];
      dVar9 = dVar9 + dVar1 * dVar1;
      dVar12 = dVar12 + dVar1 * local_48[uVar4] * dVar1 * local_48[uVar4];
    }
    if (dVar9 < 0.0) {
      fxf = dVar12;
      local_50 = sqrt(dVar9);
      dVar12 = fxf;
    }
    else {
      local_50 = SQRT(dVar9);
    }
    if (dVar12 < 0.0) {
      dVar12 = sqrt(dVar12);
    }
    else {
      dVar12 = SQRT(dVar12);
    }
    if (local_50 <= dVar12) {
      local_50 = dVar12 * 1000.0;
    }
    else {
      local_50 = local_50 * 1000.0;
    }
  }
  dVar12 = (double)local_d8._0_8_;
  if ((double)local_d8._0_8_ <= ABS((double)local_118)) {
    dVar12 = ABS((double)local_118);
  }
  for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
    dVar9 = ABS(local_48[uVar4]);
    if (ABS(local_48[uVar4]) <= 1.0 / ABS(dx[uVar4])) {
      dVar9 = 1.0 / ABS(dx[uVar4]);
    }
    local_70[uVar4] = (ABS(f[uVar4]) * dVar9) / dVar12;
  }
  dVar12 = array_max_abs(local_70,(int)local_40);
  if (dVar12 <= local_98 * 0.001) {
    local_34 = 1;
    for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      xf[uVar4] = local_48[uVar4];
    }
  }
  for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
    local_b0[uVar4] = local_48[uVar4];
  }
  local_c0 = (undefined4)local_108;
  uStack_bc = local_108._4_4_;
  for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
    tsk[uVar4] = 0.0;
    tyk[uVar4] = 0.0;
  }
  uVar3 = ((int)local_90 + -1) * (int)local_40;
  local_128 = 0;
  if (0 < (int)uVar3) {
    local_128 = (ulong)uVar3;
  }
  local_120 = (long)(int)uVar3;
  local_d8._0_8_ = (long)((int)local_90 * (int)local_40);
  local_118 = local_68 + local_120;
  fxf = (double)(local_60 + local_120);
  uVar10 = (undefined4)uStack_100;
  uVar11 = uStack_100._4_4_;
  local_78 = dx;
  do {
    pdVar6 = local_58;
    pdVar5 = local_b0;
    if (local_34 != 0) {
LAB_0012c89a:
      for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
        local_48[uVar4] = local_78[uVar4] * local_48[uVar4];
        local_78[uVar4] = 1.0 / local_78[uVar4];
      }
      free(f);
      free(local_70);
      free(pdVar5);
      free(local_a0);
      free(pdVar6);
      free(local_a8);
      free(local_68);
      free(local_60);
      free(tsk);
      free(tyk);
      return local_34;
    }
    iVar2 = *niter;
    if (MAXITER <= iVar2) {
      local_34 = 4;
      goto LAB_0012c89a;
    }
    local_108 = (double)CONCAT44(uStack_bc,local_c0);
    uStack_100 = CONCAT44(uVar11,uVar10);
    inithess_l(local_a0,(int)local_40,iVar2,tsk,tyk,local_78);
    pdVar5 = local_58;
    bfgs_rec(local_a0,(int)local_40,iVar2,(int)local_90,f,local_68,local_60,local_58);
    scale(pdVar5,1,(int)local_40,-1.0);
    for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      *(double *)((long)local_a8 + uVar4 * 8) = f[uVar4];
    }
    N_00 = (int)local_40;
    iVar2 = lnsrchmt(local_88,local_e0,local_b0,(double *)&local_c0,f,&local_140,pdVar5,N_00,
                     local_78,local_50,MAXITER,local_80,local_f0,local_98,alpha,xf);
    local_34 = stopcheck2_mt((double)CONCAT44(uStack_bc,local_c0),N_00,local_108,f,local_78,local_e8
                             ,local_98,local_f0,iVar2);
    uVar10 = 0;
    uVar11 = 0;
    for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      tsk[uVar4] = xf[uVar4] - local_b0[uVar4];
      tyk[uVar4] = f[uVar4] - *(double *)((long)local_a8 + uVar4 * 8);
    }
    iVar2 = *niter;
    pdVar5 = local_68;
    pdVar6 = local_60;
    uVar4 = local_128;
    if (iVar2 < (int)local_90) {
      for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
        local_68[(long)(iVar2 * (int)local_40) + uVar4] = tsk[uVar4];
        local_60[(long)(iVar2 * (int)local_40) + uVar4] = tyk[uVar4];
      }
    }
    else {
      while (uVar4 != 0) {
        *pdVar5 = pdVar5[local_130];
        *pdVar6 = pdVar6[local_130];
        pdVar5 = pdVar5 + 1;
        pdVar6 = pdVar6 + 1;
        uVar4 = uVar4 - 1;
      }
      for (lVar7 = 0; local_120 + lVar7 < (long)local_d8._0_8_; lVar7 = lVar7 + 1) {
        local_118[lVar7] = tsk[lVar7];
        *(double *)((long)fxf + lVar7 * 8) = tyk[lVar7];
      }
    }
    for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      local_b0[uVar4] = xf[uVar4];
      local_58[uVar4] = 0.0;
    }
    *niter = iVar2 + 1;
  } while( true );
}

Assistant:

int bfgs_l_min(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, int m, double *dx, double fsval,double maxstep, int MAXITER, int *niter,
		double eps,double gtol,double ftol,double xtol,double *xf)  {
	int rcode,gfdcode;
	int i,j,siter,retval;
	int ptr,iter;
	double dt1,dt2,alpha,fo;
	double fx,num,den,stop0,fxf,eps2;
	double *jac,*scheck,*xc,*H,*step,*jacf,*sk,*yk,*tsk,*tyk;

	jac = (double*) malloc(sizeof(double) *N);
	scheck = (double*) malloc(sizeof(double) *N);
	xc = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	H = (double*) malloc(sizeof(double) *N * N);
	jacf = (double*) malloc(sizeof(double) *N);
	sk = (double*) malloc(sizeof(double) * m * N);
	yk = (double*) malloc(sizeof(double) * m * N);
	tsk = (double*) malloc(sizeof(double) *N);
	tyk = (double*) malloc(sizeof(double) *N);

	/*
	 * Return Codes
	 *
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 *
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 *
	 */

	rcode = 0;
	*niter = 0;
	siter = MAXITER;
	eps2 = sqrt(eps);

	alpha = 1.0;
	gfdcode = 0;
	
	//set values
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt, xi, N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}
	fo = fx;

	gfdcode = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,jac);
	if (gfdcode == 15) {
		rcode = 15;
	}

	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);

		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}


	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}

	stop0 = array_max_abs(scheck,N);

	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for(i = 0; i < N;++i) {
			xf[i] = xi[i];
		}
	}

	//hessian_fd(funcpt,xi,N,dx,hess);
	//inithess_lower(L,N,fx,fsval,dx);

	for(i = 0; i < N;++i) {
		xc[i] = xi[i];
	}
	fxf = fx;

	for (i = 0; i < N; ++i) {
		tsk[i] = 0.0;
		tyk[i] = 0.0;
	}


	while (rcode == 0 && *niter < siter) {
		iter = *niter;
		inithess_l(H,N,iter,tsk,tyk,dx);

		bfgs_rec(H,N,iter,m,jac,sk,yk,step);
		//mdisplay(step,1,N);

		scale(step,1,N,-1.0);

		for (i = 0; i < N; ++i) {
			jacf[i] = jac[i];
		}

		//linsolve_lower(L,N,jac,step);

		//scale(jac,1,N,-1.0);
		//retval = lnsrchmod(funcpt,xc,jac,step,N,dx,maxstep,stol,xf,jacf);
		retval = lnsrchmt(funcpt,funcgrad, xc, &fxf, jac, &alpha, step, N, dx, maxstep,MAXITER,eps2,ftol, gtol, xtol, xf);
		//retval = lnsrch(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);

		//retval = swolfe(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);
		//printf("%g %g \n",fo,fxf);

		//grad_fd(funcpt,xf,N,dx,jacf);
		//rcode = stopcheck_mt(fxf, N, xc, xf, jac, dx, fsval, gtol, ftol, retval);
		rcode = stopcheck2_mt(fxf,N,fo,jac,dx,eps,gtol,ftol,retval);
		//rcode = stopcheck3_mt(xc,xf,fxf,N,fo,jac,dx,eps,gtol,ftol,retval);
		//printf("\n CODE %d", rcode);
		fo = fxf;
		for (i = 0; i < N;++i) {
			tsk[i] = xf[i] - xc[i];
			tyk[i] = jac[i] - jacf[i];
		}

		if (*niter >= m) {
			for (i = 0; i < (m-1) * N; ++i) {
				sk[i] = sk[N + i];
				yk[i] = yk[N + i];
			}
			j = 0;

			for (i = (m - 1) * N; i < m * N; ++i) {
				sk[i] = tsk[j];
				yk[i] = tyk[j];
				j++;
			}

		} else {
			ptr = *niter * N;

			for (i = 0; i < N;++i) {
				sk[ptr + i] = tsk[i];
				yk[ptr + i] = tyk[i];
			}

		}

		
		for(i = 0; i < N;++i) {
			xc[i] = xf[i];
			step[i] = 0.0;
		}
		*niter = *niter + 1;

	}

	//mdisplay(xc, 1, N);

	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}
	
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	


	free(jac);
	free(scheck);
	free(xc);
	free(H);
	free(step);
	free(jacf);
	free(sk);
	free(yk);
	free(tsk);
	free(tyk);
	return rcode;
}